

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

panel * get_panel_misc(void)

{
  panel *p_00;
  uint8_t attr;
  panel *p;
  
  p_00 = panel_allocate(L'\a');
  panel_line(p_00,'\x0e',"Age","%d",(ulong)(uint)(int)player->age);
  panel_line(p_00,'\x0e',"Height","%d\'%d\"",(long)(int)player->ht / 0xc & 0xffffffff,
             (long)(int)player->ht % 0xc & 0xffffffff);
  panel_line(p_00,'\x0e',"Weight","%dst %dlb",(long)(int)player->wt / 0xe & 0xffffffff,
             (long)(int)player->wt % 0xe & 0xffffffff);
  panel_line(p_00,'\x0e',"Turns used:","");
  panel_line(p_00,'\x0e',"Game","%d",(ulong)(uint)turn);
  panel_line(p_00,'\x0e',"Standard","%d",(ulong)player->total_energy / 100);
  panel_line(p_00,'\x0e',"Resting","%d",(ulong)player->resting_turn);
  return p_00;
}

Assistant:

static struct panel *get_panel_misc(void) {
	struct panel *p = panel_allocate(7);
	uint8_t attr = COLOUR_L_BLUE;

	panel_line(p, attr, "Age", "%d", player->age);
	panel_line(p, attr, "Height", "%d'%d\"", player->ht / 12, player->ht % 12);
	panel_line(p, attr, "Weight", "%dst %dlb", player->wt / 14, player->wt % 14);
	panel_line(p, attr, "Turns used:", "");
	panel_line(p, attr, "Game", "%d", turn);
	panel_line(p, attr, "Standard", "%d", player->total_energy / 100);
	panel_line(p, attr, "Resting", "%d", player->resting_turn);

	return p;
}